

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign_fwd.h
# Opt level: O2

type dlib::
     matrix_assign_default<dlib::matrix<float,0l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_exp<dlib::matrix_op<dlib::op_reciprocal<dlib::matrix_op<dlib::op_sqrt<dlib::matrix_op<dlib::op_add_scalar<dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_squared<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>>>>>>>>>
               (matrix<float,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *dest,matrix_exp<dlib::matrix_op<dlib::op_reciprocal<dlib::matrix_op<dlib::op_sqrt<dlib::matrix_op<dlib::op_add_scalar<dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_squared<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>_>_>_>_>_>_>
                      *src)

{
  bool bVar1;
  long c;
  long r;
  long r_00;
  const_ret_type cVar2;
  
  for (r_00 = 0; r_00 < *(long *)(*(long *)**(undefined8 **)**(undefined8 **)src + 8);
      r_00 = r_00 + 1) {
    bVar1 = true;
    c = 0;
    while (bVar1) {
      cVar2 = op_reciprocal<dlib::matrix_op<dlib::op_sqrt<dlib::matrix_op<dlib::op_add_scalar<dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_squared<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>_>_>_>_>
              ::apply((op_reciprocal<dlib::matrix_op<dlib::op_sqrt<dlib::matrix_op<dlib::op_add_scalar<dlib::matrix_op<dlib::op_sumc<dlib::matrix_op<dlib::op_squared<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>_>_>_>_>_>
                       *)src,r_00,c);
      (dest->data).data[r_00 + c] = cVar2;
      bVar1 = false;
      c = 1;
    }
  }
  return;
}

Assistant:

inline typename disable_if<ma::has_column_major_layout<EXP1> >::type  
    matrix_assign_default (
        EXP1& dest,
        const EXP2& src
    )
    /*!
        requires
            - src.destructively_aliases(dest) == false
            - dest.nr() == src.nr()
            - dest.nc() == src.nc()
        ensures
            - #dest == src
    !*/
    {
        for (long r = 0; r < src.nr(); ++r)
        {
            for (long c = 0; c < src.nc(); ++c)
            {
                dest(r,c) = src(r,c);
            }
        }
    }